

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O2

double compute_error(vec *last_layer,int nx)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = 1;
  if (1 < nx) {
    iVar1 = nx;
  }
  uVar2 = 0;
  dVar5 = 0.0;
  while (dVar3 = dVar5, iVar1 - 1 != uVar2) {
    dVar5 = (last_layer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    uVar2 = uVar2 + 1;
    dVar4 = exact_solution((double)(int)uVar2 * (0.7853981633974483 / (double)nx),1.0);
    dVar5 = ABS(dVar5 - dVar4);
    if (dVar5 <= dVar3) {
      dVar5 = dVar3;
    }
  }
  return dVar3;
}

Assistant:

double compute_error(const vec& last_layer, int nx)
{
    double max_error = 0.0;
    double h = X / nx;

    for (int i = 0; i < nx - 1; i++)
    {
        double current_error =
            std::abs(last_layer[i] - exact_solution(h * (i + 1), T));
        if (current_error > max_error)
        {
            max_error = current_error;
        }
    }

    return max_error;
}